

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_> * __thiscall
cmLocalGenerator::AddUnityFilesModeAuto
          (vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
           *__return_storage_ptr__,cmLocalGenerator *this,cmGeneratorTarget *target,string *lang,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configs,vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                   *filtered_sources,cmValue beforeInclude,cmValue afterInclude,
          string *filename_base,size_t batchSize)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pUVar2;
  pointer pUVar3;
  pointer pcVar4;
  pointer pcVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  unsigned_long val;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  cmRange<__gnu_cxx::__normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>
  sources;
  string filename;
  string local_108;
  long local_e8;
  cmLocalGenerator *local_e0;
  cmGeneratorTarget *local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_d0;
  vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
  *local_c8;
  string *local_c0;
  unsigned_long local_b8;
  ulong local_b0;
  long local_a8;
  UnitySource local_a0;
  char *pcStack_78;
  long local_70;
  char *local_68;
  cmAlphaNum local_60;
  
  pUVar2 = (filtered_sources->
           super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pUVar3 = (filtered_sources->
           super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_b0 = (long)pUVar2 - (long)pUVar3 >> 5;
  if (batchSize == 0) {
    batchSize = local_b0;
  }
  (__return_storage_ptr__->
  super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pUVar2 != pUVar3) {
    local_e8 = batchSize << 5;
    local_a8 = 0;
    val = 0;
    local_e0 = this;
    local_d8 = target;
    local_d0 = configs;
    local_c8 = filtered_sources;
    local_c0 = lang;
    do {
      uVar8 = local_b0;
      if (batchSize < local_b0) {
        uVar8 = batchSize;
      }
      pcVar4 = (filename_base->_M_dataplus)._M_p;
      pcVar5 = (pointer)filename_base->_M_string_length;
      iVar7 = std::__cxx11::string::compare((char *)local_c0);
      local_a0.Path.field_2._M_allocated_capacity = 6;
      local_a0.Path.field_2._8_8_ = (long)" unity_" + 1;
      local_b8 = val;
      local_a0.Path._M_dataplus._M_p = pcVar5;
      local_a0.Path._M_string_length = (size_type)pcVar4;
      cmAlphaNum::cmAlphaNum(&local_60,val);
      local_68 = "_cxx.cxx";
      if (iVar7 == 0) {
        local_68 = "_c.c";
      }
      local_a0._32_8_ = local_60.View_._M_len;
      pcStack_78 = local_60.View_._M_str;
      local_70 = (ulong)(iVar7 != 0) * 4 + 4;
      views._M_len = 4;
      views._M_array = (iterator)&local_a0;
      cmCatViews_abi_cxx11_(&filename,views);
      lVar6 = local_a8;
      pUVar2 = (local_c8->
               super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
               )._M_impl.super__Vector_impl_data._M_start;
      paVar1 = &filename.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filename._M_dataplus._M_p == paVar1) {
        local_108.field_2._8_8_ = filename.field_2._8_8_;
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      }
      else {
        local_108._M_dataplus._M_p = filename._M_dataplus._M_p;
      }
      local_108.field_2._M_allocated_capacity._1_7_ = filename.field_2._M_allocated_capacity._1_7_;
      local_108.field_2._M_local_buf[0] = filename.field_2._M_local_buf[0];
      sources.End._M_current = (UnityBatchedSource *)((long)&pUVar2[uVar8].Source + local_a8);
      local_108._M_string_length = filename._M_string_length;
      filename._M_string_length = 0;
      filename.field_2._M_local_buf[0] = '\0';
      sources.Begin._M_current = (UnityBatchedSource *)((long)&pUVar2->Source + local_a8);
      filename._M_dataplus._M_p = (pointer)paVar1;
      WriteUnitySource(&local_a0,local_e0,local_d8,local_d0,sources,beforeInclude,afterInclude,
                       &local_108);
      std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>::
      emplace_back<cmLocalGenerator::UnitySource>(__return_storage_ptr__,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.Path._M_dataplus._M_p != &local_a0.Path.field_2) {
        operator_delete(local_a0.Path._M_dataplus._M_p,
                        local_a0.Path.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filename._M_dataplus._M_p != paVar1) {
        operator_delete(filename._M_dataplus._M_p,
                        CONCAT71(filename.field_2._M_allocated_capacity._1_7_,
                                 filename.field_2._M_local_buf[0]) + 1);
      }
      val = local_b8 + 1;
      local_a8 = lVar6 + local_e8;
      local_b0 = local_b0 - uVar8;
    } while (local_b0 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<cmLocalGenerator::UnitySource>
cmLocalGenerator::AddUnityFilesModeAuto(
  cmGeneratorTarget* target, std::string const& lang,
  std::vector<std::string> const& configs,
  std::vector<UnityBatchedSource> const& filtered_sources,
  cmValue beforeInclude, cmValue afterInclude,
  std::string const& filename_base, size_t batchSize)
{
  if (batchSize == 0) {
    batchSize = filtered_sources.size();
  }

  std::vector<UnitySource> unity_files;
  for (size_t itemsLeft = filtered_sources.size(), chunk, batch = 0;
       itemsLeft > 0; itemsLeft -= chunk, ++batch) {

    chunk = std::min(itemsLeft, batchSize);

    std::string filename = cmStrCat(filename_base, "unity_", batch,
                                    (lang == "C") ? "_c.c" : "_cxx.cxx");
    auto const begin = filtered_sources.begin() + batch * batchSize;
    auto const end = begin + chunk;
    unity_files.emplace_back(this->WriteUnitySource(
      target, configs, cmMakeRange(begin, end), beforeInclude, afterInclude,
      std::move(filename)));
  }
  return unity_files;
}